

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O0

void * __thiscall cnn::AlignedMemoryPool::allocate(AlignedMemoryPool *this,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  size_t in_RSI;
  ulong *in_RDI;
  void *res;
  size_t rounded_n;
  
  sVar2 = MemAllocator::round_up_align((MemAllocator *)in_RDI[3],in_RSI);
  if (*in_RDI < sVar2 + in_RDI[1]) {
    std::operator<<((ostream *)&std::cerr,"cnn is out of memory, try increasing with --cnn-mem\n");
    abort();
  }
  uVar1 = in_RDI[1];
  in_RDI[1] = sVar2 + in_RDI[1];
  return (void *)(in_RDI[4] + uVar1);
}

Assistant:

void* allocate(size_t n) {
    auto rounded_n = a->round_up_align(n);
    if (rounded_n + used > capacity) {
      std::cerr << "cnn is out of memory, try increasing with --cnn-mem\n";
      abort();
    }
    void* res = static_cast<char*>(mem) + used;
    used += rounded_n;
    return res;
  }